

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boost_unordered.hpp
# Opt level: O2

void __thiscall
boost::unordered::detail::foa::
table_iterator<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::shared_ptr<slang::DiagArgFormatter>_>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>_*,_false>
::increment(void *this)

{
  char cVar1;
  long lVar2;
  uint uVar3;
  char *pcVar4;
  long lVar5;
  long lVar6;
  uint uVar7;
  ulong uVar8;
  long lVar9;
  undefined1 auVar10 [16];
  
  lVar2 = *this;
  lVar9 = 0;
  lVar5 = *(long *)((long)this + 8);
LAB_0019c30b:
  lVar6 = lVar5 + 0x18;
  if (((int)lVar2 + (int)lVar9 & 0xfU) != 0xe) goto code_r0x0019c31d;
  *(long *)((long)this + 8) = lVar6;
  lVar6 = lVar2 + lVar9;
  *(long *)this = lVar2 + lVar9 + 2;
  lVar5 = lVar5 + 0x180;
  while( true ) {
    auVar10[0] = -(*(char *)(lVar6 + 2) == '\0');
    auVar10[1] = -(*(char *)(lVar6 + 3) == '\0');
    auVar10[2] = -(*(char *)(lVar6 + 4) == '\0');
    auVar10[3] = -(*(char *)(lVar6 + 5) == '\0');
    auVar10[4] = -(*(char *)(lVar6 + 6) == '\0');
    auVar10[5] = -(*(char *)(lVar6 + 7) == '\0');
    auVar10[6] = -(*(char *)(lVar6 + 8) == '\0');
    auVar10[7] = -(*(char *)(lVar6 + 9) == '\0');
    auVar10[8] = -(*(char *)(lVar6 + 10) == '\0');
    auVar10[9] = -(*(char *)(lVar6 + 0xb) == '\0');
    auVar10[10] = -(*(char *)(lVar6 + 0xc) == '\0');
    auVar10[0xb] = -(*(char *)(lVar6 + 0xd) == '\0');
    auVar10[0xc] = -(*(char *)(lVar6 + 0xe) == '\0');
    auVar10[0xd] = -(*(char *)(lVar6 + 0xf) == '\0');
    auVar10[0xe] = -(*(char *)(lVar6 + 0x10) == '\0');
    auVar10[0xf] = -(*(char *)(lVar6 + 0x11) == '\0');
    uVar7 = (uint)(ushort)((ushort)(SUB161(auVar10 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar10 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar10 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar10 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar10 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar10 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar10 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar10 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar10 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar10 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar10 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar10 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar10 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar10 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar10 >> 0x77,0) & 1) << 0xe);
    if (uVar7 != 0x7fff) break;
    *(long *)this = lVar6 + 0x12;
    *(long *)((long)this + 8) = lVar5;
    lVar5 = lVar5 + 0x168;
    lVar6 = lVar6 + 0x10;
  }
  uVar7 = uVar7 ^ 0x7fff;
  uVar3 = 0;
  if (uVar7 != 0) {
    for (; (uVar7 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
    }
  }
  uVar8 = (ulong)uVar3;
  if (*(char *)(lVar6 + 2 + uVar8) != '\x01') {
    *(ulong *)this = lVar6 + uVar8 + 2;
    lVar6 = uVar8 * 0x18 + lVar5 + -0x168;
    goto LAB_0019c33c;
  }
  goto LAB_0019c3b9;
code_r0x0019c31d:
  pcVar4 = (char *)(lVar2 + lVar9 + 1);
  *(char **)this = pcVar4;
  cVar1 = *pcVar4;
  lVar9 = lVar9 + 1;
  lVar5 = lVar6;
  if (cVar1 != '\0') {
    if (cVar1 == '\x01') {
LAB_0019c3b9:
      lVar6 = 0;
    }
LAB_0019c33c:
    *(long *)((long)this + 8) = lVar6;
    return;
  }
  goto LAB_0019c30b;
}

Assistant:

inline void increment(std::true_type /* regular layout */) noexcept {
        using diff_type = typename std::pointer_traits<char_pointer>::difference_type;

        for (;;) {
            ++p_;
            if (reinterpret_cast<uintptr_t>(pc()) % sizeof(group_type) == N - 1) {
                pc_ += static_cast<diff_type>(sizeof(group_type) - (N - 1));
                break;
            }
            ++pc_;
            if (!group_type::is_occupied(pc()))
                continue;
            if (BOOST_UNLIKELY(group_type::is_sentinel(pc())))
                p_ = nullptr;
            return;
        }

        for (;;) {
            int mask = reinterpret_cast<group_type*>(pc())->match_occupied();
            if (mask != 0) {
                auto n = unchecked_countr_zero(mask);
                if (BOOST_UNLIKELY(reinterpret_cast<group_type*>(pc())->is_sentinel(n))) {
                    p_ = nullptr;
                }
                else {
                    pc_ += static_cast<diff_type>(n);
                    p_ += static_cast<diff_type>(n);
                }
                return;
            }
            pc_ += static_cast<diff_type>(sizeof(group_type));
            p_ += static_cast<diff_type>(N);
        }
    }